

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

ptr<async_result<bool>_> __thiscall
cornerstone::raft_server::add_srv(raft_server *this,srv_config *srv)

{
  element_type *this_00;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *__x;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  msg_type *in_RSI;
  element_type *in_RDI;
  ptr<async_result<bool>_> pVar1;
  ptr<req_msg> req;
  ptr<log_entry> log;
  bufptr buf;
  log_val_type *in_stack_ffffffffffffff38;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *in_stack_ffffffffffffff40;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *this_01;
  unsigned_long *in_stack_ffffffffffffff48;
  element_type *args_2;
  srv_config *this_02;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> local_90;
  uint in_stack_ffffffffffffff88;
  srv_config local_28;
  
  this_02 = &local_28;
  args_2 = in_RDI;
  srv_config::serialize(this_02);
  cs_new<cornerstone::log_entry,int,std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,cornerstone::log_val_type>
            ((int *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_90._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl = (buffer *)0x0;
  local_90._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)(_func_void_buffer_ptr *)0x0;
  this_01 = &local_90;
  cs_new<cornerstone::req_msg,unsigned_long,cornerstone::msg_type,int,int,unsigned_long,unsigned_long,unsigned_long>
            ((unsigned_long *)this_02,in_RSI,(int *)args_2,(int *)in_RDI,in_stack_ffffffffffffff48,
             (unsigned_long *)0x0,(unsigned_long *)(ulong)in_stack_ffffffffffffff88);
  this_00 = std::__shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1c005c);
  __x = req_msg::log_entries(this_00);
  std::
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  ::push_back((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               *)in_RDI,(value_type *)__x);
  send_msg_to_leader((raft_server *)
                     log.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi,
                     (ptr<req_msg> *)
                     log.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  std::shared_ptr<cornerstone::req_msg>::~shared_ptr((shared_ptr<cornerstone::req_msg> *)0x1c009f);
  std::shared_ptr<cornerstone::log_entry>::~shared_ptr
            ((shared_ptr<cornerstone::log_entry> *)0x1c00ac);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr(this_01);
  pVar1.
  super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  pVar1.
  super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = args_2;
  return (ptr<async_result<bool>_>)
         pVar1.
         super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<async_result<bool>> raft_server::add_srv(const srv_config& srv)
{
    bufptr buf(srv.serialize());
    ptr<log_entry> log(cs_new<log_entry>(0, std::move(buf), log_val_type::cluster_server));
    ptr<req_msg> req(cs_new<req_msg>((ulong)0, msg_type::add_server_request, 0, 0, (ulong)0, (ulong)0, (ulong)0));
    req->log_entries().push_back(log);
    return send_msg_to_leader(req);
}